

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O1

void __thiscall
btGjkPairDetector::getClosestPointsNonVirtual
          (btGjkPairDetector *this,ClosestPointInput *input,Result *output,btIDebugDraw *debugDraw)

{
  btVector3 *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  btConvexPenetrationDepthSolver *pbVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  undefined8 extraout_XMM0_Qb;
  float fVar14;
  btScalar bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btScalar bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btVector3 bVar29;
  btVector3 bVar30;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float local_1d8;
  float fStack_1d4;
  btVector3 pWorld;
  btVector3 qWorld;
  btVector3 seperatingAxisInB;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  btVector3 seperatingAxisInA;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  float fStack_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  float fStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  btVector3 newCachedSeparatingAxis;
  btVector3 w;
  float local_78;
  float fStack_74;
  float local_68;
  
  this->m_cachedSeparatingDistance = 0.0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_128 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
  uStack_120 = *(undefined8 *)((input->m_transformA).m_basis.m_el[0].m_floats + 2);
  local_118 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
  uStack_110 = *(undefined8 *)((input->m_transformA).m_basis.m_el[1].m_floats + 2);
  local_108 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
  uStack_100 = *(undefined8 *)((input->m_transformA).m_basis.m_el[2].m_floats + 2);
  uVar2 = *(undefined8 *)(input->m_transformA).m_origin.m_floats;
  uVar3 = *(undefined8 *)((input->m_transformA).m_origin.m_floats + 2);
  local_168 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
  uStack_160 = *(undefined8 *)((input->m_transformB).m_basis.m_el[0].m_floats + 2);
  local_158 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
  uStack_150 = *(undefined8 *)((input->m_transformB).m_basis.m_el[1].m_floats + 2);
  local_148 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
  uStack_140 = *(undefined8 *)((input->m_transformB).m_basis.m_el[2].m_floats + 2);
  uVar4 = *(undefined8 *)(input->m_transformB).m_origin.m_floats;
  uVar6 = *(undefined8 *)((input->m_transformB).m_origin.m_floats + 2);
  fStack_f0 = (float)uVar3;
  fStack_130 = (float)uVar6;
  fVar17 = (float)uVar2;
  fVar12 = (float)((ulong)uVar2 >> 0x20);
  fVar18 = (float)uVar4;
  fVar23 = (float)((ulong)uVar4 >> 0x20);
  fVar20 = (fVar17 + fVar18) * 0.5;
  fVar21 = (fVar12 + fVar23) * 0.5;
  fVar22 = (fStack_f0 + fStack_130) * 0.5;
  local_f8 = CONCAT44(fVar12 - fVar21,fVar17 - fVar20);
  _fStack_f0 = CONCAT44((int)((ulong)uVar3 >> 0x20),fStack_f0 - fVar22);
  local_138 = CONCAT44(fVar23 - fVar21,fVar18 - fVar20);
  _fStack_130 = CONCAT44((int)((ulong)uVar6 >> 0x20),fStack_130 - fVar22);
  if ((this->m_minkowskiA->super_btCollisionShape).m_shapeType - 0x11U < 2) {
    bVar11 = (this->m_minkowskiB->super_btCollisionShape).m_shapeType - 0x11U < 2;
  }
  else {
    bVar11 = false;
  }
  bVar15 = this->m_marginA;
  gNumGjkChecks = gNumGjkChecks + 1;
  bVar8 = this->m_ignoreMargin;
  _local_e8 = ZEXT816(0);
  if (bVar8 == false) {
    _local_e8 = ZEXT416((uint)this->m_marginB);
  }
  pbVar1 = &this->m_cachedSeparatingAxis;
  (this->m_cachedSeparatingAxis).m_floats[0] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[1] = 1.0;
  (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
  this->m_degenerateSimplex = 0;
  this->m_lastUsedMethod = -1;
  this->m_curIter = 0;
  btVoronoiSimplexSolver::reset(this->m_simplexSolver);
  local_1e8 = 1e+18;
  bVar10 = false;
  do {
    fVar18 = (this->m_cachedSeparatingAxis).m_floats[0];
    fVar17 = (this->m_cachedSeparatingAxis).m_floats[1];
    fVar23 = -fVar18;
    fVar12 = (this->m_cachedSeparatingAxis).m_floats[2];
    uVar2 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
    uVar3 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
    uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
    seperatingAxisInA.m_floats[0] =
         (fVar23 * (float)uVar2 - (float)uVar3 * fVar17) - (float)uVar4 * fVar12;
    seperatingAxisInA.m_floats[1] =
         (fVar23 * (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20) * fVar17) -
         (float)((ulong)uVar4 >> 0x20) * fVar12;
    seperatingAxisInA.m_floats[2] =
         ((input->m_transformA).m_basis.m_el[0].m_floats[2] * fVar23 -
         (input->m_transformA).m_basis.m_el[1].m_floats[2] * fVar17) -
         (input->m_transformA).m_basis.m_el[2].m_floats[2] * fVar12;
    seperatingAxisInA.m_floats[3] = 0.0;
    uVar2 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
    uVar3 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
    uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
    seperatingAxisInB.m_floats[1] =
         (float)((ulong)uVar4 >> 0x20) * fVar12 +
         fVar18 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20) * fVar17;
    seperatingAxisInB.m_floats[0] =
         (float)uVar4 * fVar12 + fVar18 * (float)uVar2 + (float)uVar3 * fVar17;
    seperatingAxisInB.m_floats[2] =
         fVar12 * (input->m_transformB).m_basis.m_el[2].m_floats[2] +
         fVar18 * (input->m_transformB).m_basis.m_el[0].m_floats[2] +
         fVar17 * (input->m_transformB).m_basis.m_el[1].m_floats[2];
    seperatingAxisInB.m_floats[3] = 0.0;
    bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                       (this->m_minkowskiA,&seperatingAxisInA);
    bVar30 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                       (this->m_minkowskiB,&seperatingAxisInB);
    fVar18 = bVar30.m_floats[2];
    local_198 = bVar29.m_floats[0];
    fStack_194 = bVar29.m_floats[1];
    local_1d8 = bVar29.m_floats[2];
    pWorld.m_floats[0] =
         (float)local_f8 +
         (float)uStack_120 * local_1d8 + (float)local_128 * local_198 + local_128._4_4_ * fStack_194
    ;
    pWorld.m_floats[1] =
         (float)((ulong)local_f8 >> 0x20) +
         (float)uStack_110 * local_1d8 + (float)local_118 * local_198 + local_118._4_4_ * fStack_194
    ;
    bVar29.m_floats[2] =
         (float)uStack_100 * local_1d8 + (float)local_108 * local_198 + local_108._4_4_ * fStack_194
         + fStack_f0;
    bVar29.m_floats[0] = pWorld.m_floats[0];
    bVar29.m_floats[1] = pWorld.m_floats[1];
    bVar29.m_floats[3] = 0.0;
    fVar17 = bVar30.m_floats[0];
    fVar12 = bVar30.m_floats[1];
    qWorld.m_floats[0] =
         (float)local_138 +
         (float)uStack_160 * fVar18 + (float)local_168 * fVar17 + local_168._4_4_ * fVar12;
    qWorld.m_floats[1] =
         (float)((ulong)local_138 >> 0x20) +
         (float)uStack_150 * fVar18 + (float)local_158 * fVar17 + local_158._4_4_ * fVar12;
    qWorld.m_floats =
         (btScalar  [4])
         CONCAT412(0.0,CONCAT48((float)uStack_140 * fVar18 +
                                (float)local_148 * fVar17 + local_148._4_4_ * fVar12 + fStack_130,
                                CONCAT44(qWorld.m_floats[1],qWorld.m_floats[0])));
    if (bVar11) {
      pWorld.m_floats[2] = 0.0;
      pWorld.m_floats[3] = 0.0;
      qWorld.m_floats[2] = 0.0;
      qWorld.m_floats[3] = 0.0;
      bVar29.m_floats = pWorld.m_floats;
    }
    pWorld.m_floats = bVar29.m_floats;
    w.m_floats[0] = pWorld.m_floats[0] - qWorld.m_floats[0];
    w.m_floats[1] = pWorld.m_floats[1] - qWorld.m_floats[1];
    w.m_floats[2] = pWorld.m_floats[2] - qWorld.m_floats[2];
    w.m_floats[3] = 0.0;
    fVar17 = (this->m_cachedSeparatingAxis).m_floats[2] * (pWorld.m_floats[2] - qWorld.m_floats[2])
             + (this->m_cachedSeparatingAxis).m_floats[0] * w.m_floats[0] +
               (this->m_cachedSeparatingAxis).m_floats[1] * w.m_floats[1];
    if ((fVar17 <= 0.0) || (fVar17 * fVar17 <= input->m_maximumDistanceSquared * local_1e8)) {
      bVar7 = btVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&w);
      if (bVar7) {
        this->m_degenerateSimplex = 1;
        goto LAB_00180c07;
      }
      if (local_1e8 - fVar17 <= local_1e8 * 1e-06) {
        this->m_degenerateSimplex = (uint)(0.0 < local_1e8 - fVar17) * 9 + 2;
        goto LAB_00180c07;
      }
      btVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&w,&pWorld,&qWorld);
      bVar7 = btVoronoiSimplexSolver::closest(this->m_simplexSolver,&newCachedSeparatingAxis);
      iVar9 = 3;
      if (bVar7) {
        fVar17 = newCachedSeparatingAxis.m_floats[2] * newCachedSeparatingAxis.m_floats[2] +
                 newCachedSeparatingAxis.m_floats[0] * newCachedSeparatingAxis.m_floats[0] +
                 newCachedSeparatingAxis.m_floats[1] * newCachedSeparatingAxis.m_floats[1];
        if (fVar17 < 1e-06) {
          *(undefined8 *)pbVar1->m_floats = newCachedSeparatingAxis.m_floats._0_8_;
          *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) =
               newCachedSeparatingAxis.m_floats._8_8_;
          iVar9 = 6;
          fVar17 = local_1e8;
LAB_00180c84:
          bVar10 = true;
          local_1e8 = fVar17;
          goto LAB_00180c87;
        }
        iVar9 = 0xc;
        if (local_1e8 - fVar17 <= local_1e8 * 1.1920929e-07) goto LAB_00180c84;
        *(undefined8 *)pbVar1->m_floats = newCachedSeparatingAxis.m_floats._0_8_;
        *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) =
             newCachedSeparatingAxis.m_floats._8_8_;
        iVar9 = this->m_curIter;
        this->m_curIter = iVar9 + 1;
        if (1000 < iVar9) goto LAB_00180c8b;
        bVar7 = true;
        iVar9 = 0xd;
        local_1e8 = fVar17;
        if (this->m_simplexSolver->m_numVertices == 4) goto LAB_00180c87;
      }
      else {
        bVar10 = true;
LAB_00180c87:
        this->m_degenerateSimplex = iVar9;
        fVar17 = local_1e8;
LAB_00180c8b:
        bVar7 = false;
        local_1e8 = fVar17;
      }
    }
    else {
      this->m_degenerateSimplex = 10;
LAB_00180c07:
      bVar10 = true;
      bVar7 = false;
    }
    if (!bVar7) {
      fVar17 = 0.0;
      fVar12 = 0.0;
      if (bVar8 == false) {
        fVar12 = bVar15;
      }
      fVar18 = fVar12 + (float)local_e8._0_4_;
      if (bVar10) {
        btVoronoiSimplexSolver::compute_points
                  (this->m_simplexSolver,&seperatingAxisInA,&seperatingAxisInB);
        local_1f8 = *(ulong *)pbVar1->m_floats;
        uStack_1f0 = *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2);
        fVar17 = (this->m_cachedSeparatingAxis).m_floats[0];
        fVar23 = (this->m_cachedSeparatingAxis).m_floats[1];
        fVar14 = (this->m_cachedSeparatingAxis).m_floats[2];
        fVar17 = fVar14 * fVar14 + fVar17 * fVar17 + fVar23 * fVar23;
        if (fVar17 < 0.0001) {
          this->m_degenerateSimplex = 5;
        }
        if (fVar17 <= 1.4210855e-14) {
          fVar17 = 0.0;
          iVar9 = 2;
          bVar11 = false;
        }
        else {
          if (fVar17 < 0.0) {
            fVar17 = sqrtf(fVar17);
          }
          else {
            fVar17 = SQRT(fVar17);
          }
          fVar17 = 1.0 / fVar17;
          local_1f8 = CONCAT44(fVar17 * (float)(local_1f8 >> 0x20),fVar17 * (float)local_1f8);
          uStack_1f0._4_4_ = (undefined4)((ulong)uStack_1f0 >> 0x20);
          uStack_1f0 = CONCAT44(uStack_1f0._4_4_,(float)uStack_1f0 * fVar17);
          if (local_1e8 < 0.0) {
            local_1e8 = sqrtf(local_1e8);
          }
          else {
            local_1e8 = SQRT(local_1e8);
          }
          bVar30.m_floats = seperatingAxisInA.m_floats;
          bVar29.m_floats = seperatingAxisInB.m_floats;
          fVar14 = fVar12 / local_1e8;
          fVar23 = (this->m_cachedSeparatingAxis).m_floats[2];
          uVar2 = *(undefined8 *)(this->m_cachedSeparatingAxis).m_floats;
          fVar13 = (float)uVar2;
          fVar16 = (float)((ulong)uVar2 >> 0x20);
          fVar24 = seperatingAxisInA.m_floats[0];
          seperatingAxisInA.m_floats[1] = seperatingAxisInA.m_floats[1] - fVar14 * fVar16;
          seperatingAxisInA.m_floats[0] = fVar24 - fVar14 * fVar13;
          seperatingAxisInA.m_floats[2] = bVar30.m_floats[2];
          seperatingAxisInA.m_floats[3] = bVar30.m_floats[3];
          seperatingAxisInA.m_floats[2] = seperatingAxisInA.m_floats[2] - fVar14 * fVar23;
          local_1e8 = (float)local_e8._0_4_ / local_1e8;
          fVar14 = seperatingAxisInB.m_floats[0];
          seperatingAxisInB.m_floats[1] = seperatingAxisInB.m_floats[1] + local_1e8 * fVar16;
          seperatingAxisInB.m_floats[0] = fVar14 + local_1e8 * fVar13;
          seperatingAxisInB.m_floats[2] = bVar29.m_floats[2];
          seperatingAxisInB.m_floats[3] = bVar29.m_floats[3];
          seperatingAxisInB.m_floats[2] = fVar23 * local_1e8 + seperatingAxisInB.m_floats[2];
          fVar17 = 1.0 / fVar17 - fVar18;
          bVar11 = true;
          iVar9 = 1;
        }
        this->m_lastUsedMethod = iVar9;
      }
      else {
        bVar11 = false;
      }
      pbVar5 = this->m_penetrationDepthSolver;
      bVar8 = true;
      if (((this->m_catchDegeneracies != 0) && (pbVar5 != (btConvexPenetrationDepthSolver *)0x0)) &&
         (this->m_degenerateSimplex != 0)) {
        bVar8 = 0.01 <= fVar18 + fVar17;
      }
      if (!(bool)(bVar8 & bVar11) && pbVar5 != (btConvexPenetrationDepthSolver *)0x0) {
        gNumDeepPenetrationChecks = gNumDeepPenetrationChecks + 1;
        pbVar1->m_floats[0] = 0.0;
        pbVar1->m_floats[1] = 0.0;
        (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
        (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
        iVar9 = (*pbVar5->_vptr_btConvexPenetrationDepthSolver[2])
                          (pbVar5,this->m_simplexSolver,this->m_minkowskiA,this->m_minkowskiB,
                           &local_128,&local_168,pbVar1,&pWorld,&qWorld,debugDraw);
        if ((char)iVar9 == '\0') {
          fVar23 = (this->m_cachedSeparatingAxis).m_floats[0];
          fVar14 = (this->m_cachedSeparatingAxis).m_floats[1];
          fVar13 = (this->m_cachedSeparatingAxis).m_floats[2];
          if (0.0 < fVar13 * fVar13 + fVar23 * fVar23 + fVar14 * fVar14) {
            fVar23 = (pWorld.m_floats[2] - qWorld.m_floats[2]) *
                     (pWorld.m_floats[2] - qWorld.m_floats[2]) +
                     (pWorld.m_floats[0] - qWorld.m_floats[0]) *
                     (pWorld.m_floats[0] - qWorld.m_floats[0]) +
                     (pWorld.m_floats[1] - qWorld.m_floats[1]) *
                     (pWorld.m_floats[1] - qWorld.m_floats[1]);
            if (fVar23 < 0.0) {
              fVar23 = sqrtf(fVar23);
            }
            else {
              fVar23 = SQRT(fVar23);
            }
            if ((!bVar11) || (iVar9 = 5, fVar23 - fVar18 < fVar17)) {
              fVar17 = (this->m_cachedSeparatingAxis).m_floats[2];
              uVar2 = *(undefined8 *)(this->m_cachedSeparatingAxis).m_floats;
              fVar14 = (float)uVar2;
              fVar13 = (float)((ulong)uVar2 >> 0x20);
              seperatingAxisInA.m_floats[1] = pWorld.m_floats[1] - fVar12 * fVar13;
              seperatingAxisInA.m_floats[0] = pWorld.m_floats[0] - fVar12 * fVar14;
              seperatingAxisInA.m_floats[2] = pWorld.m_floats[2];
              seperatingAxisInA.m_floats[3] = pWorld.m_floats[3];
              seperatingAxisInA.m_floats[2] = seperatingAxisInA.m_floats[2] - fVar12 * fVar17;
              seperatingAxisInB.m_floats[1] = qWorld.m_floats[1] + (float)local_e8._0_4_ * fVar13;
              seperatingAxisInB.m_floats[0] = qWorld.m_floats[0] + (float)local_e8._0_4_ * fVar14;
              seperatingAxisInB.m_floats[2] = qWorld.m_floats[2];
              seperatingAxisInB.m_floats[3] = qWorld.m_floats[3];
              seperatingAxisInB.m_floats[2] =
                   fVar17 * (float)local_e8._0_4_ + seperatingAxisInB.m_floats[2];
              uVar2 = *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2);
              local_1f8._0_4_ = (float)*(undefined8 *)pbVar1->m_floats;
              local_1f8._4_4_ = (float)((ulong)*(undefined8 *)pbVar1->m_floats >> 0x20);
              uStack_1f0._0_4_ = (float)uVar2;
              fVar17 = (float)uStack_1f0 * (float)uStack_1f0 +
                       (float)local_1f8 * (float)local_1f8 + local_1f8._4_4_ * local_1f8._4_4_;
              if (fVar17 < 0.0) {
                fVar17 = sqrtf(fVar17);
              }
              else {
                fVar17 = SQRT(fVar17);
              }
              fVar17 = 1.0 / fVar17;
              local_1f8 = CONCAT44(fVar17 * local_1f8._4_4_,fVar17 * (float)local_1f8);
              uStack_1f0._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
              uStack_1f0 = CONCAT44(uStack_1f0._4_4_,fVar17 * (float)uStack_1f0);
              bVar11 = true;
              iVar9 = 6;
              fVar17 = fVar23 - fVar18;
            }
            this->m_lastUsedMethod = iVar9;
          }
        }
        else {
          fVar18 = qWorld.m_floats[0] - pWorld.m_floats[0];
          fVar23 = qWorld.m_floats[1] - pWorld.m_floats[1];
          bVar15 = qWorld.m_floats[2] - pWorld.m_floats[2];
          fVar12 = bVar15 * bVar15 + fVar18 * fVar18 + fVar23 * fVar23;
          if (fVar12 <= 1.4210855e-14) {
            uVar2 = *(undefined8 *)(this->m_cachedSeparatingAxis).m_floats;
            fVar18 = (float)uVar2;
            fVar23 = (float)((ulong)uVar2 >> 0x20);
            bVar15 = (this->m_cachedSeparatingAxis).m_floats[2];
            bVar19 = (this->m_cachedSeparatingAxis).m_floats[3];
            fVar12 = (this->m_cachedSeparatingAxis).m_floats[0];
            fVar14 = (this->m_cachedSeparatingAxis).m_floats[1];
            fVar13 = (this->m_cachedSeparatingAxis).m_floats[2];
            fVar12 = fVar13 * fVar13 + fVar12 * fVar12 + fVar14 * fVar14;
          }
          else {
            bVar19 = 0.0;
          }
          if (fVar12 <= 1.4210855e-14) {
            this->m_lastUsedMethod = 9;
          }
          else {
            if (fVar12 < 0.0) {
              fVar12 = sqrtf(fVar12);
            }
            else {
              fVar12 = SQRT(fVar12);
            }
            fVar14 = (pWorld.m_floats[2] - qWorld.m_floats[2]) *
                     (pWorld.m_floats[2] - qWorld.m_floats[2]) +
                     (pWorld.m_floats[0] - qWorld.m_floats[0]) *
                     (pWorld.m_floats[0] - qWorld.m_floats[0]) +
                     (pWorld.m_floats[1] - qWorld.m_floats[1]) *
                     (pWorld.m_floats[1] - qWorld.m_floats[1]);
            if (fVar14 < 0.0) {
              local_e8._0_4_ = fVar12;
              fVar14 = sqrtf(fVar14);
              fVar12 = (float)local_e8._0_4_;
            }
            else {
              fVar14 = SQRT(fVar14);
            }
            this->m_lastUsedMethod = 3;
            if ((!bVar11) || (-fVar14 < fVar17)) {
              fVar12 = 1.0 / fVar12;
              fVar17 = bVar15 * fVar12;
              fVar18 = fVar18 * fVar12;
              fVar23 = fVar23 * fVar12;
              local_1f8 = CONCAT44(fVar23,fVar18);
              seperatingAxisInA = pWorld;
              seperatingAxisInB = qWorld;
              uVar2 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
              uVar3 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
              uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
              w.m_floats[0] = (float)uVar4 * fVar17 + fVar18 * (float)uVar2 + (float)uVar3 * fVar23;
              w.m_floats[1] =
                   (float)((ulong)uVar4 >> 0x20) * fVar17 +
                   fVar18 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20) * fVar23;
              w.m_floats[2] =
                   (input->m_transformA).m_basis.m_el[2].m_floats[2] * fVar17 +
                   (input->m_transformA).m_basis.m_el[0].m_floats[2] * fVar18 +
                   (input->m_transformA).m_basis.m_el[1].m_floats[2] * fVar23;
              w.m_floats[3] = 0.0;
              fVar12 = -fVar18;
              uVar2 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
              uVar3 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
              uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
              newCachedSeparatingAxis.m_floats[0] =
                   (fVar12 * (float)uVar2 - (float)uVar3 * fVar23) - (float)uVar4 * fVar17;
              newCachedSeparatingAxis.m_floats[1] =
                   (fVar12 * (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20) * fVar23)
                   - (float)((ulong)uVar4 >> 0x20) * fVar17;
              newCachedSeparatingAxis.m_floats[2] =
                   ((input->m_transformB).m_basis.m_el[0].m_floats[2] * fVar12 -
                   fVar23 * (input->m_transformB).m_basis.m_el[1].m_floats[2]) -
                   fVar17 * (input->m_transformB).m_basis.m_el[2].m_floats[2];
              newCachedSeparatingAxis.m_floats[3] = 0.0;
              bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                 (this->m_minkowskiA,&w);
              bVar30 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                 (this->m_minkowskiB,&newCachedSeparatingAxis);
              fVar16 = bVar30.m_floats[2];
              fVar12 = bVar30.m_floats[0];
              fVar13 = bVar30.m_floats[1];
              local_198 = bVar29.m_floats[0];
              fStack_194 = bVar29.m_floats[1];
              fStack_190 = (float)extraout_XMM0_Qb;
              fStack_18c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
              local_1d8 = bVar29.m_floats[2];
              fStack_1d4 = bVar29.m_floats[3];
              fVar27 = (float)local_f8 +
                       (float)uStack_120 * local_1d8 +
                       (float)local_128 * local_198 + local_128._4_4_ * fStack_194;
              fVar28 = (float)local_138 +
                       (float)uStack_160 * fVar16 +
                       (float)local_168 * fVar12 + local_168._4_4_ * fVar13;
              fVar25 = local_f8._4_4_ +
                       (float)uStack_110 * local_1d8 +
                       (float)local_118 * local_198 + local_118._4_4_ * fStack_194;
              fVar26 = local_138._4_4_ +
                       (float)uStack_150 * fVar16 +
                       (float)local_158 * fVar12 + local_158._4_4_ * fVar13;
              local_e8._4_4_ =
                   fStack_130 +
                   (float)uStack_140 * fVar16 + (float)local_148 * fVar12 + local_148._4_4_ * fVar13
              ;
              local_e8._0_4_ =
                   fStack_f0 +
                   (float)uStack_100 * local_1d8 +
                   (float)local_108 * local_198 + local_108._4_4_ * fStack_194;
              fStack_e0 = (float)local_f8 * fStack_1d4 +
                          (float)uStack_100 * fStack_194 + uStack_100._4_4_ * fStack_190 + 0.0;
              fStack_dc = local_f8._4_4_ * bVar30.m_floats[3] +
                          uStack_100._4_4_ * fVar13 + (float)local_f8 * fStack_18c + 0.0;
              fVar24 = -fVar18;
              uVar2 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
              uVar3 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
              uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
              w.m_floats[1] =
                   (fVar24 * (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20) * fVar23)
                   - (float)((ulong)uVar4 >> 0x20) * fVar17;
              w.m_floats[0] =
                   (fVar24 * (float)uVar2 - (float)uVar3 * fVar23) - (float)uVar4 * fVar17;
              w.m_floats[2] =
                   ((input->m_transformA).m_basis.m_el[0].m_floats[2] * fVar24 -
                   (input->m_transformA).m_basis.m_el[1].m_floats[2] * fVar23) -
                   (input->m_transformA).m_basis.m_el[2].m_floats[2] * fVar17;
              w.m_floats[3] = 0.0;
              uVar2 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
              uVar3 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
              uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
              newCachedSeparatingAxis.m_floats[0] =
                   (float)uVar4 * fVar17 + fVar18 * (float)uVar2 + (float)uVar3 * fVar23;
              newCachedSeparatingAxis.m_floats[1] =
                   (float)((ulong)uVar4 >> 0x20) * fVar17 +
                   fVar18 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar3 >> 0x20) * fVar23;
              newCachedSeparatingAxis.m_floats[2] =
                   fVar17 * (input->m_transformB).m_basis.m_el[2].m_floats[2] +
                   fVar18 * (input->m_transformB).m_basis.m_el[0].m_floats[2] +
                   fVar23 * (input->m_transformB).m_basis.m_el[1].m_floats[2];
              newCachedSeparatingAxis.m_floats[3] = 0.0;
              bVar29 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                 (this->m_minkowskiA,&w);
              bVar30 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                 (this->m_minkowskiB,&newCachedSeparatingAxis);
              fVar16 = bVar30.m_floats[2];
              fVar12 = bVar30.m_floats[0];
              fVar13 = bVar30.m_floats[1];
              local_78 = bVar29.m_floats[0];
              fStack_74 = bVar29.m_floats[1];
              local_68 = bVar29.m_floats[2];
              bVar11 = true;
              if (fVar17 * ((fStack_f0 +
                            (float)uStack_100 * local_68 +
                            (float)local_108 * local_78 + local_108._4_4_ * fStack_74) -
                           (fStack_130 +
                           (float)uStack_140 * fVar16 +
                           (float)local_148 * fVar12 + local_148._4_4_ * fVar13)) +
                  fVar18 * (((float)local_f8 +
                            (float)uStack_120 * local_68 +
                            (float)local_128 * local_78 + local_128._4_4_ * fStack_74) -
                           ((float)local_138 +
                           (float)uStack_160 * fVar16 +
                           (float)local_168 * fVar12 + local_168._4_4_ * fVar13)) +
                  fVar23 * ((local_f8._4_4_ +
                            (float)uStack_110 * local_68 +
                            (float)local_118 * local_78 + local_118._4_4_ * fStack_74) -
                           (local_138._4_4_ +
                           (float)uStack_150 * fVar16 +
                           (float)local_158 * fVar12 + local_158._4_4_ * fVar13)) <
                  -fVar17 * ((float)local_e8._0_4_ - (float)local_e8._4_4_) +
                  fVar24 * (fVar27 - fVar28) + -fVar23 * (fVar25 - fVar26)) {
                this->m_lastUsedMethod = 10;
                local_1f8 = CONCAT44(fVar23,fVar18) ^ 0x8000000080000000;
                fVar17 = -fVar17;
              }
              uStack_1f0 = CONCAT44(bVar19,fVar17);
              fVar17 = -fVar14;
            }
            else {
              this->m_lastUsedMethod = 8;
            }
          }
        }
      }
      if ((bVar11) && ((fVar17 < 0.0 || (fVar17 * fVar17 < input->m_maximumDistanceSquared)))) {
        *(ulong *)pbVar1->m_floats = local_1f8;
        *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) = uStack_1f0;
        this->m_cachedSeparatingDistance = fVar17;
        pWorld.m_floats[1] = fVar21 + seperatingAxisInB.m_floats[1];
        pWorld.m_floats[0] = fVar20 + seperatingAxisInB.m_floats[0];
        pWorld.m_floats[2] = fVar22 + seperatingAxisInB.m_floats[2];
        pWorld.m_floats[3] = 0.0;
        (*output->_vptr_Result[4])();
      }
      return;
    }
  } while( true );
}

Assistant:

void btGjkPairDetector::getClosestPointsNonVirtual(const ClosestPointInput& input, Result& output, class btIDebugDraw* debugDraw)
#endif
{
	m_cachedSeparatingDistance = 0.f;

	btScalar distance=btScalar(0.);
	btVector3	normalInB(btScalar(0.),btScalar(0.),btScalar(0.));

	btVector3 pointOnA,pointOnB;
	btTransform	localTransA = input.m_transformA;
	btTransform localTransB = input.m_transformB;
	btVector3 positionOffset=(localTransA.getOrigin() + localTransB.getOrigin()) * btScalar(0.5);
	localTransA.getOrigin() -= positionOffset;
	localTransB.getOrigin() -= positionOffset;

	bool check2d = m_minkowskiA->isConvex2d() && m_minkowskiB->isConvex2d();

	btScalar marginA = m_marginA;
	btScalar marginB = m_marginB;

	gNumGjkChecks++;

	//for CCD we don't use margins
	if (m_ignoreMargin)
	{
		marginA = btScalar(0.);
		marginB = btScalar(0.);
	}

	m_curIter = 0;
	int gGjkMaxIter = 1000;//this is to catch invalid input, perhaps check for #NaN?
	m_cachedSeparatingAxis.setValue(0,1,0);

	bool isValid = false;
	bool checkSimplex = false;
	bool checkPenetration = true;
	m_degenerateSimplex = 0;

	m_lastUsedMethod = -1;

	{
		btScalar squaredDistance = BT_LARGE_FLOAT;
		btScalar delta = btScalar(0.);
		
		btScalar margin = marginA + marginB;
		
		

		m_simplexSolver->reset();
		
		for ( ; ; )
		//while (true)
		{

			btVector3 seperatingAxisInA = (-m_cachedSeparatingAxis)* input.m_transformA.getBasis();
			btVector3 seperatingAxisInB = m_cachedSeparatingAxis* input.m_transformB.getBasis();


			btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
			btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

			btVector3  pWorld = localTransA(pInA);	
			btVector3  qWorld = localTransB(qInB);


			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			btVector3 w	= pWorld - qWorld;
			delta = m_cachedSeparatingAxis.dot(w);

			// potential exit, they don't overlap
			if ((delta > btScalar(0.0)) && (delta * delta > squaredDistance * input.m_maximumDistanceSquared)) 
			{
				m_degenerateSimplex = 10;
				checkSimplex=true;
				//checkPenetration = false;
				break;
			}

			//exit 0: the new point is already in the simplex, or we didn't come any closer
			if (m_simplexSolver->inSimplex(w))
			{
				m_degenerateSimplex = 1;
				checkSimplex = true;
				break;
			}
			// are we getting any closer ?
			btScalar f0 = squaredDistance - delta;
			btScalar f1 = squaredDistance * REL_ERROR2;

			if (f0 <= f1)
			{
				if (f0 <= btScalar(0.))
				{
					m_degenerateSimplex = 2;
				} else
				{
					m_degenerateSimplex = 11;
				}
				checkSimplex = true;
				break;
			}

			//add current vertex to simplex
			m_simplexSolver->addVertex(w, pWorld, qWorld);
			btVector3 newCachedSeparatingAxis;

			//calculate the closest point to the origin (update vector v)
			if (!m_simplexSolver->closest(newCachedSeparatingAxis))
			{
				m_degenerateSimplex = 3;
				checkSimplex = true;
				break;
			}

			if(newCachedSeparatingAxis.length2()<REL_ERROR2)
            {
				m_cachedSeparatingAxis = newCachedSeparatingAxis;
                m_degenerateSimplex = 6;
                checkSimplex = true;
                break;
            }

			btScalar previousSquaredDistance = squaredDistance;
			squaredDistance = newCachedSeparatingAxis.length2();
#if 0
///warning: this termination condition leads to some problems in 2d test case see Bullet/Demos/Box2dDemo
			if (squaredDistance>previousSquaredDistance)
			{
				m_degenerateSimplex = 7;
				squaredDistance = previousSquaredDistance;
                checkSimplex = false;
                break;
			}
#endif //
			

			//redundant m_simplexSolver->compute_points(pointOnA, pointOnB);

			//are we getting any closer ?
			if (previousSquaredDistance - squaredDistance <= SIMD_EPSILON * previousSquaredDistance) 
			{ 
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				checkSimplex = true;
				m_degenerateSimplex = 12;
				
				break;
			}

			m_cachedSeparatingAxis = newCachedSeparatingAxis;

			  //degeneracy, this is typically due to invalid/uninitialized worldtransforms for a btCollisionObject   
              if (m_curIter++ > gGjkMaxIter)   
              {   
                      #if defined(DEBUG) || defined (_DEBUG)

                              printf("btGjkPairDetector maxIter exceeded:%i\n",m_curIter);   
                              printf("sepAxis=(%f,%f,%f), squaredDistance = %f, shapeTypeA=%i,shapeTypeB=%i\n",   
                              m_cachedSeparatingAxis.getX(),   
                              m_cachedSeparatingAxis.getY(),   
                              m_cachedSeparatingAxis.getZ(),   
                              squaredDistance,   
                              m_minkowskiA->getShapeType(),   
                              m_minkowskiB->getShapeType());   

                      #endif   
                      break;   

              } 


			bool check = (!m_simplexSolver->fullSimplex());
			//bool check = (!m_simplexSolver->fullSimplex() && squaredDistance > SIMD_EPSILON * m_simplexSolver->maxVertex());

			if (!check)
			{
				//do we need this backup_closest here ?
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				m_degenerateSimplex = 13;
				break;
			}
		}

		if (checkSimplex)
		{
			m_simplexSolver->compute_points(pointOnA, pointOnB);
			normalInB = m_cachedSeparatingAxis;

			btScalar lenSqr =m_cachedSeparatingAxis.length2();
			
			//valid normal
			if (lenSqr < 0.0001)
			{
				m_degenerateSimplex = 5;
			} 
			if (lenSqr > SIMD_EPSILON*SIMD_EPSILON)
			{
				btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
				normalInB *= rlen; //normalize

				btScalar s = btSqrt(squaredDistance);
			
				btAssert(s > btScalar(0.0));
				pointOnA -= m_cachedSeparatingAxis * (marginA / s);
				pointOnB += m_cachedSeparatingAxis * (marginB / s);
				distance = ((btScalar(1.)/rlen) - margin);
				isValid = true;
				
				m_lastUsedMethod = 1;
			} else
			{
				m_lastUsedMethod = 2;
			}
		}

		bool catchDegeneratePenetrationCase = 
			(m_catchDegeneracies && m_penetrationDepthSolver && m_degenerateSimplex && ((distance+margin) < 0.01));

		//if (checkPenetration && !isValid)
		if (checkPenetration && (!isValid || catchDegeneratePenetrationCase ))
		{
			//penetration case

			//if there is no way to handle penetrations, bail out
			if (m_penetrationDepthSolver)
			{
				// Penetration depth case.
				btVector3 tmpPointOnA,tmpPointOnB;
				
				gNumDeepPenetrationChecks++;
				m_cachedSeparatingAxis.setZero();

				bool isValid2 = m_penetrationDepthSolver->calcPenDepth( 
					*m_simplexSolver, 
					m_minkowskiA,m_minkowskiB,
					localTransA,localTransB,
					m_cachedSeparatingAxis, tmpPointOnA, tmpPointOnB,
					debugDraw
					);


				if (isValid2)
				{
					btVector3 tmpNormalInB = tmpPointOnB-tmpPointOnA;
					btScalar lenSqr = tmpNormalInB.length2();
					if (lenSqr <= (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB = m_cachedSeparatingAxis;
						lenSqr = m_cachedSeparatingAxis.length2();
					}

					if (lenSqr > (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB /= btSqrt(lenSqr);
						btScalar distance2 = -(tmpPointOnA-tmpPointOnB).length();
						m_lastUsedMethod = 3;
						//only replace valid penetrations when the result is deeper (check)
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							normalInB = tmpNormalInB;
							///todo: need to track down this EPA penetration solver degeneracy
							///the penetration solver reports penetration but the contact normal
							///connecting the contact points is pointing in the opposite direction
							///until then, detect the issue and revert the normal
							{
								btScalar d1=0;
								{
									btVector3 seperatingAxisInA = (normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = -normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d1 = (-normalInB).dot(w);
								}
								btScalar d0 = 0.f;
								{
									btVector3 seperatingAxisInA = (-normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d0 = normalInB.dot(w);
								}
								if (d1>d0)
								{
									m_lastUsedMethod = 10;
									normalInB*=-1;
								} 

							}
							isValid = true;
							
						} else
						{
							m_lastUsedMethod = 8;
						}
					} else
					{
						m_lastUsedMethod = 9;
					}
				} else

				{
					///this is another degenerate case, where the initial GJK calculation reports a degenerate case
					///EPA reports no penetration, and the second GJK (using the supporting vector without margin)
					///reports a valid positive distance. Use the results of the second GJK instead of failing.
					///thanks to Jacob.Langford for the reproduction case
					///http://code.google.com/p/bullet/issues/detail?id=250

				
					if (m_cachedSeparatingAxis.length2() > btScalar(0.))
					{
						btScalar distance2 = (tmpPointOnA-tmpPointOnB).length()-margin;
						//only replace valid distances when the distance is less
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							pointOnA -= m_cachedSeparatingAxis * marginA ;
							pointOnB += m_cachedSeparatingAxis * marginB ;
							normalInB = m_cachedSeparatingAxis;
							normalInB.normalize();

							isValid = true;
							m_lastUsedMethod = 6;
						} else
						{
							m_lastUsedMethod = 5;
						}
					}
				}
				
			}

		}
	}

	

	if (isValid && ((distance < 0) || (distance*distance < input.m_maximumDistanceSquared)))
	{

		m_cachedSeparatingAxis = normalInB;
		m_cachedSeparatingDistance = distance;

		output.addContactPoint(
			normalInB,
			pointOnB+positionOffset,
			distance);

	}


}